

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::PopulateFormalsScope
          (ByteCodeGenerator *this,uint beginOffset,FuncInfo *funcInfo,ParseNodeFnc *pnodeFnc)

{
  anon_class_40_5_07c1c418 handler;
  anon_class_40_5_07c1c418 handler_00;
  DebuggerScope *this_00;
  ParseNodeVar *pPVar1;
  ParseNode *pPVar2;
  ParseNodeParamPattern *pPVar3;
  FunctionBody *pFVar4;
  DiagExtraScopesType DVar5;
  ParseNodeFnc *local_58;
  ParseNodeFnc *pnodeFnc_local;
  FuncInfo *pFStack_48;
  uint beginOffset_local;
  FuncInfo *funcInfo_local;
  DebuggerScope *local_38;
  DebuggerScope *debuggerScope;
  
  local_38 = (DebuggerScope *)0x0;
  this_00 = (DebuggerScope *)0x0;
  pnodeFnc_local._4_4_ = beginOffset;
  funcInfo_local._4_4_ = beginOffset;
  pFStack_48 = funcInfo;
  local_58 = pnodeFnc;
  for (pPVar2 = pnodeFnc->pnodeParams; pPVar2 != (ParseNode *)0x0;
      pPVar2 = ParseNode::GetFormalNext(pPVar2)) {
    if ((byte)(pPVar2->nop + ~knopList) < 3) {
      if (this_00 == (DebuggerScope *)0x0) {
        if (funcInfo->paramScope == (Scope *)0x0) {
          DVar5 = DiagParamScope;
        }
        else {
          DVar5 = DiagParamScopeInObject - ((funcInfo->paramScope->field_0x44 & 2) == 0);
        }
        this_00 = RecordStartScopeObject
                            (this,&pnodeFnc->super_ParseNode,DVar5,0xffffffff,(int *)0x0);
        Js::DebuggerScope::SetBegin(this_00,funcInfo_local._4_4_);
      }
      pPVar1 = ParseNode::AsParseNodeVar(pPVar2);
      InsertPropertyToDebuggerScope(this,funcInfo,this_00,pPVar1->sym);
    }
  }
  pPVar2 = pnodeFnc->pnodeRest;
  local_38 = this_00;
  if ((pPVar2 != (ParseNode *)0x0) && ((byte)(pPVar2->nop + ~knopList) < 3)) {
    if (this_00 == (DebuggerScope *)0x0) {
      if (funcInfo->paramScope == (Scope *)0x0) {
        DVar5 = DiagParamScope;
      }
      else {
        DVar5 = DiagParamScopeInObject - ((funcInfo->paramScope->field_0x44 & 2) == 0);
      }
      this_00 = RecordStartScopeObject(this,&pnodeFnc->super_ParseNode,DVar5,0xffffffff,(int *)0x0);
      local_38 = this_00;
      Js::DebuggerScope::SetBegin(this_00,funcInfo_local._4_4_);
    }
    pPVar1 = ParseNode::AsParseNodeVar(pPVar2);
    InsertPropertyToDebuggerScope(this,funcInfo,this_00,pPVar1->sym);
  }
  for (pPVar2 = pnodeFnc->pnodeParams; pPVar2 != (ParseNode *)0x0;
      pPVar2 = ParseNode::GetFormalNext(pPVar2)) {
    if (pPVar2->nop == knopParamPattern) {
      pPVar3 = ParseNode::AsParseNodeParamPattern(pPVar2);
      handler.this = this;
      handler.debuggerScope = &local_38;
      handler.pnodeFnc = &local_58;
      handler.funcInfo = &stack0xffffffffffffffb8;
      handler.beginOffset = (uint *)((long)&pnodeFnc_local + 4);
      Parser::
      MapBindIdentifier<ByteCodeGenerator::PopulateFormalsScope(unsigned_int,FuncInfo*,ParseNodeFnc*)::__0>
                ((pPVar3->super_ParseNodeUni).pnode1,handler);
    }
  }
  pPVar2 = pnodeFnc->pnodeRest;
  if ((pPVar2 != (ParseNode *)0x0) && (pPVar2->nop == knopParamPattern)) {
    pPVar3 = ParseNode::AsParseNodeParamPattern(pPVar2);
    handler_00.this = this;
    handler_00.debuggerScope = &local_38;
    handler_00.pnodeFnc = &local_58;
    handler_00.funcInfo = &stack0xffffffffffffffb8;
    handler_00.beginOffset = (uint *)((long)&pnodeFnc_local + 4);
    Parser::
    MapBindIdentifier<ByteCodeGenerator::PopulateFormalsScope(unsigned_int,FuncInfo*,ParseNodeFnc*)::__0>
              ((pPVar3->super_ParseNodeUni).pnode1,handler_00);
  }
  if (local_38 != (DebuggerScope *)0x0) {
    pFVar4 = FuncInfo::GetParsedFunctionBody(pFStack_48);
    if ((pFVar4->field_0x17b & 4) == 0) {
      InsertPropertyToDebuggerScope(this,pFStack_48,local_38,pFStack_48->argumentsSymbol);
    }
    RecordEndScopeObject(this,&local_58->super_ParseNode);
  }
  return;
}

Assistant:

void ByteCodeGenerator::PopulateFormalsScope(uint beginOffset, FuncInfo *funcInfo, ParseNodeFnc *pnodeFnc)
{
    Js::DebuggerScope *debuggerScope = nullptr;
    auto processArg = [&](ParseNode *pnodeArg) {
        if (pnodeArg->IsVarLetOrConst())
        {
            if (debuggerScope == nullptr)
            {
                debuggerScope = RecordStartScopeObject(pnodeFnc, funcInfo->paramScope && funcInfo->paramScope->GetIsObject() ? Js::DiagParamScopeInObject : Js::DiagParamScope);
                debuggerScope->SetBegin(beginOffset);
            }

            InsertPropertyToDebuggerScope(funcInfo, debuggerScope, pnodeArg->AsParseNodeVar()->sym);
        }
    };

    MapFormals(pnodeFnc, processArg);
    MapFormalsFromPattern(pnodeFnc, processArg);

    if (debuggerScope != nullptr)
    {
        if (!funcInfo->GetParsedFunctionBody()->IsParamAndBodyScopeMerged())
        {
            InsertPropertyToDebuggerScope(funcInfo, debuggerScope, funcInfo->GetArgumentsSymbol());
        }

        RecordEndScopeObject(pnodeFnc);
    }
}